

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_variance.c
# Opt level: O3

uint av1_get_variance_boost_block_variance(AV1_COMP *cpi,MACROBLOCK *x)

{
  int iVar1;
  aom_variance_fn_t p_Var2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint *puVar6;
  uint *puVar7;
  uint8_t *puVar8;
  long lVar9;
  uint sse;
  uint variances [64];
  uint local_13c;
  uint local_138 [31];
  int local_bc;
  int local_9c;
  int local_7c;
  
  puVar8 = "";
  if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
    puVar8 = (uint8_t *)0x2b35d8;
  }
  p_Var2 = cpi->ppi->fn_ptr[3].vf;
  iVar4 = 0;
  puVar6 = local_138;
  lVar5 = 0;
  do {
    lVar9 = 0;
    puVar7 = puVar6;
    do {
      iVar1 = x->plane[0].src.stride;
      uVar3 = (*p_Var2)(x->plane[0].src.buf + lVar9 + iVar4 * iVar1,iVar1,puVar8,0,&local_13c);
      *puVar7 = uVar3 >> 6;
      lVar9 = lVar9 + 8;
      puVar7 = puVar7 + 1;
    } while (lVar9 != 0x40);
    lVar5 = lVar5 + 1;
    iVar4 = iVar4 + 8;
    puVar6 = puVar6 + 8;
  } while (lVar5 != 8);
  qsort(local_138,0x40,4,comp_unsigned_int);
  return local_9c * 2 + local_bc + local_7c + 2U >> 2;
}

Assistant:

unsigned int av1_get_variance_boost_block_variance(const AV1_COMP *cpi,
                                                   const MACROBLOCK *x) {
#define SUPERBLOCK_SIZE 64
#define SUBBLOCK_SIZE 8
#define SUBBLOCKS_IN_SB_DIM (SUPERBLOCK_SIZE / SUBBLOCK_SIZE)
#define SUBBLOCKS_IN_SB (SUBBLOCKS_IN_SB_DIM * SUBBLOCKS_IN_SB_DIM)
#define SUBBLOCKS_IN_OCTILE (SUBBLOCKS_IN_SB / 8)
  DECLARE_ALIGNED(16, static const uint16_t,
                  av1_highbd_all_zeros[SUBBLOCK_SIZE]) = { 0 };
  DECLARE_ALIGNED(16, static const uint8_t,
                  av1_all_zeros[SUBBLOCK_SIZE]) = { 0 };

  const MACROBLOCKD *xd = &x->e_mbd;
  unsigned int sse;
  // Octile is currently hard-coded and optimized for still pictures. In the
  // future, we might want to expose this as a parameter that can be fine-tuned
  // by the caller.
  // An octile of 5 was chosen because it was found to strike the best balance
  // between quality and consistency. Lower octiles tend to score lower in
  // SSIMU2, while higher octiles tend to harm subjective quality consistency,
  // especially in <1 MP images.
  const int octile = 5;
  const uint8_t *all_zeros = is_cur_buf_hbd(xd)
                                 ? CONVERT_TO_BYTEPTR(av1_highbd_all_zeros)
                                 : av1_all_zeros;
  unsigned int variances[SUBBLOCKS_IN_SB];

  // Calculate subblock variances.
  aom_variance_fn_t vf = cpi->ppi->fn_ptr[BLOCK_8X8].vf;
  for (int subb_i = 0; subb_i < SUBBLOCKS_IN_SB_DIM; subb_i++) {
    int i = subb_i * SUBBLOCK_SIZE;
    for (int subb_j = 0; subb_j < SUBBLOCKS_IN_SB_DIM; subb_j++) {
      int j = subb_j * SUBBLOCK_SIZE;
      // Truncating values to integers (i.e. the 64 term) was found to perform
      // better than rounding, or returning them as doubles.
      variances[subb_i * SUBBLOCKS_IN_SB_DIM + subb_j] =
          vf(x->plane[0].src.buf + i * x->plane[0].src.stride + j,
             x->plane[0].src.stride, all_zeros, 0, &sse) /
          64;
    }
  }

  // Order the 8x8 SB values from smallest to largest variance.
  qsort(variances, SUBBLOCKS_IN_SB, sizeof(unsigned int), comp_unsigned_int);

  // Sample three 8x8 variance values: at the specified octile, previous octile,
  // and next octile. Make sure we use the last subblock in each octile as the
  // representative of the octile.
  assert(octile >= 1 && octile <= 8);
  const int middle_index = octile * SUBBLOCKS_IN_OCTILE - 1;
  const int lower_index =
      AOMMAX(SUBBLOCKS_IN_OCTILE - 1, middle_index - SUBBLOCKS_IN_OCTILE);
  const int upper_index =
      AOMMIN(SUBBLOCKS_IN_SB - 1, middle_index + SUBBLOCKS_IN_OCTILE);

  // Weigh the three variances in a 1:2:1 ratio, with rounding (the +2 term).
  // This allows for smoother delta-q transitions among superblocks with
  // mixed-variance features.
  const unsigned int variance =
      (variances[lower_index] + (variances[middle_index] * 2) +
       variances[upper_index] + 2) /
      4;

  return variance;
}